

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O0

void aom_dc_predictor_16x64_c(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  undefined8 in_RSI;
  ptrdiff_t in_RDI;
  uint8_t *unaff_retaddr;
  int in_stack_00000010;
  
  dc_predictor_rect(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_RDX,in_RCX,
                    in_stack_00000010,(int)left);
  return;
}

Assistant:

void aom_dc_predictor_16x64_c(uint8_t *dst, ptrdiff_t stride,
                              const uint8_t *above, const uint8_t *left) {
  dc_predictor_rect(dst, stride, 16, 64, above, left, 4, DC_MULTIPLIER_1X4);
}